

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::testEntity(DOMTest *this,DOMDocument *document)

{
  bool bVar1;
  int iVar2;
  DOMOperationType DVar3;
  long *plVar4;
  DOMNode *pDVar5;
  wchar16 *pwVar6;
  wchar16 *pwVar7;
  long lVar8;
  DOMDocument *pDVar9;
  DOMNode *pDVar10;
  DOMNode *pDVar11;
  XMLCh *pXVar12;
  DOMDocument *pDVar13;
  DOMNode *pDVar14;
  ulong uVar15;
  DOMException *e;
  DOMNode *myimport;
  DOMNode *mycloned;
  void *myNull2;
  void *mydocument2;
  void *myNull;
  void *mySecond2;
  void *mySecond;
  void *myFirst2;
  void *myFirst;
  void *mydocument;
  XMLCh *userSecond;
  DOMNode *userFirst;
  DOMEntity *userTest;
  DOMNode *abc20;
  bool OK;
  DOMNode *node2;
  DOMNode *node;
  DOMEntity *entity;
  DOMDocument *document_local;
  DOMTest *this_local;
  
  bVar1 = true;
  xercesc_4_0::XMLString::transcode
            ("ourEntityNode",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar4 = (long *)(**(code **)(*(long *)document + 0x58))();
  plVar4 = (long *)(**(code **)(*plVar4 + 0x148))();
  pDVar5 = (DOMNode *)(**(code **)(*plVar4 + 0x20))(plVar4,tempStr);
  plVar4 = (long *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x10))();
  pwVar7 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
  iVar2 = xercesc_4_0::XMLString::compareString(pwVar6,pwVar7);
  if (((iVar2 == 0) && (lVar8 = (**(code **)(*(long *)pDVar5 + 0x18))(), lVar8 != 0)) &&
     (lVar8 = (**(code **)(*plVar4 + 0x18))(), lVar8 != 0)) {
    pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x18))();
    pwVar7 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar6,pwVar7);
    if (iVar2 == 0) goto LAB_00123b42;
  }
  else {
    lVar8 = (**(code **)(*(long *)pDVar5 + 0x18))();
    if ((lVar8 == 0) && (lVar8 = (**(code **)(*plVar4 + 0x18))(), lVar8 == 0)) goto LAB_00123b42;
  }
  fprintf(_stderr,"\'cloneNode\' did not clone the DOMEntity* node correctly");
  bVar1 = false;
LAB_00123b42:
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,0);
  pDVar9 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (document != pDVar9) {
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0xe09);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,pDVar5,0);
  pDVar10 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pDVar5 != pDVar10) {
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0xe10);
    bVar1 = false;
  }
  pDVar10 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,tempStr2,0);
  pDVar11 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pDVar11 != (DOMNode *)tempStr2) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe18);
    bVar1 = false;
  }
  if (pDVar5 != pDVar10) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe1c);
    bVar1 = false;
  }
  if (pDVar5 == pDVar11) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe20);
    bVar1 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr3);
  if (lVar8 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0xe28);
    bVar1 = false;
  }
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (lVar8 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0xe2e);
    bVar1 = false;
  }
  pXVar12 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,0);
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar12 != tempStr2) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe36);
    bVar1 = false;
  }
  if (lVar8 != 0) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe3a);
    bVar1 = false;
  }
  pDVar13 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,0);
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (pDVar9 != pDVar13) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe41);
    bVar1 = false;
  }
  if (lVar8 != 0) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe45);
    bVar1 = false;
  }
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (lVar8 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0xe4b);
    bVar1 = false;
  }
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (lVar8 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0xe4f);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,&userhandler);
  pDVar10 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_CLONED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0xe57)
    ;
    bVar1 = false;
  }
  pXVar12 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar12,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0xe57);
    bVar1 = false;
  }
  pDVar9 = (DOMDocument *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar9 != document) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0xe57);
    bVar1 = false;
  }
  pDVar11 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar11 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0xe57);
    bVar1 = false;
  }
  pDVar11 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar11 != pDVar10) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0xe57);
    bVar1 = false;
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar11 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar5,1);
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_IMPORTED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0xe5c)
    ;
    bVar1 = false;
  }
  pXVar12 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar12,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0xe5c);
    bVar1 = false;
  }
  pDVar9 = (DOMDocument *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar9 != document) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0xe5c);
    bVar1 = false;
  }
  pDVar14 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar14 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0xe5c);
    bVar1 = false;
  }
  pDVar14 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar14 != pDVar11) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0xe5c);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar11 + 0xe8))(pDVar11,tempStr2,pDVar5,&userhandler);
  (**(code **)(*(long *)pDVar11 + 0x138))();
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_DELETED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0xe61)
    ;
    bVar1 = false;
  }
  pXVar12 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar12,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0xe61);
    bVar1 = false;
  }
  pDVar11 = (DOMNode *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar11 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0xe61);
    bVar1 = false;
  }
  pDVar11 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar11 != (DOMNode *)0x0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0xe61);
    bVar1 = false;
  }
  pDVar11 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar11 != (DOMNode *)0x0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0xe61);
    bVar1 = false;
  }
  uVar15 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pDVar5);
  if ((uVar15 & 1) == 0) {
    fprintf(_stderr,"isSameNode failed in line %i\n",0xe65);
    bVar1 = false;
  }
  uVar15 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pDVar5);
  if ((uVar15 & 1) != 0) {
    fprintf(_stderr,"isSameNode failed in line %i\n",0xe69);
    bVar1 = false;
  }
  uVar15 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar10);
  if ((uVar15 & 1) == 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0xe6f);
    bVar1 = false;
  }
  uVar15 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar5);
  if ((uVar15 & 1) == 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0xe74);
    bVar1 = false;
  }
  uVar15 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar5);
  if ((uVar15 & 1) != 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0xe78);
    bVar1 = false;
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar5,0,tempStr2);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0xd2);
  if (bVar1 == false) {
    printf(
          "\n*****The DOMEntity* method calls listed above failed, all others worked correctly.*****\n"
          );
  }
  return bVar1;
}

Assistant:

bool DOMTest::testEntity(DOMDocument* document)
{
    DOMEntity* entity;
    DOMNode* node, *node2;
    bool OK = true;
// For debugging*****   printf("\n          testEntity's outputs:\n\n");
    XMLString::transcode("ourEntityNode", tempStr, 3999);
    DOMNode*  abc20 = document->getDoctype()->getEntities()->getNamedItem(tempStr);
    entity = (DOMEntity*) abc20;
    node = entity;
    node2 = entity->cloneNode(true);
    // Check nodes for equality, both their name and value or lack thereof
    if (!(!XMLString::compareString(node->getNodeName(), node2->getNodeName()) &&        // Compares node names for equality
          (node->getNodeValue() != 0 && node2->getNodeValue() != 0)     // Checks to make sure each node has a value node
        ? !XMLString::compareString(node->getNodeValue(), node2->getNodeValue())         // If both have value nodes test those value nodes for equality
        : (node->getNodeValue() == 0 && node2->getNodeValue() == 0)))   // If one node doesn't have a value node make sure both don't
    {
        fprintf(stderr, "'cloneNode' did not clone the DOMEntity* node correctly");
        OK = false;
    }
    // Deep clone test comparison is in testNode & testDocument

    // Test the user data
    // Test simple set and get
    DOMEntity* userTest = entity;
    DOMNode*  userFirst = node;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(userFirst)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 210 );

    if (!OK)
        printf("\n*****The DOMEntity* method calls listed above failed, all others worked correctly.*****\n");
    return OK;
}